

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O0

void __thiscall
Fl_File_Chooser::Fl_File_Chooser(Fl_File_Chooser *this,char *d,char *p,int t,char *title)

{
  int minw;
  int minh;
  int maxw;
  int maxh;
  Fl_Preferences *this_00;
  Fl_Double_Window *pFVar1;
  Fl_Group *pFVar2;
  Fl_Choice *this_01;
  Fl_Menu_Button *this_02;
  Fl_Button *this_03;
  Fl_Image *img;
  Fl_File_Browser *pFVar3;
  Fl_Window *pFVar4;
  Fl_Box *pFVar5;
  Fl_Check_Button *pFVar6;
  Fl_File_Input *this_04;
  Fl_Return_Button *pFVar7;
  Fl_Button *pFVar8;
  Fl_Widget *this_05;
  int local_b4;
  Fl_Widget *pFStack_b0;
  int e;
  Fl_Box *o_12;
  Fl_Group *o_11;
  Fl_Group *o_10;
  Fl_Box *o_9;
  Fl_Button *o_8;
  Fl_Group *o_7;
  Fl_Box *o_6;
  Fl_Box *o_5;
  Fl_Group *o_4;
  Fl_Group *o_3;
  Fl_Tile *o_2;
  Fl_Button *o_1;
  Fl_Group *o;
  Fl_Group *prev_current;
  char *local_30;
  char *title_local;
  char *pcStack_20;
  int t_local;
  char *p_local;
  char *d_local;
  Fl_File_Chooser *this_local;
  
  local_30 = title;
  title_local._4_4_ = t;
  pcStack_20 = p;
  p_local = d;
  d_local = (char *)this;
  if (prefs_ == (Fl_Preferences *)0x0) {
    this_00 = (Fl_Preferences *)operator_new(0x18);
    Fl_Preferences::Fl_Preferences(this_00,USER,"fltk.org","filechooser");
    prefs_ = this_00;
  }
  o = Fl_Group::current();
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x1ea,0x17c,"Choose File");
  this->window = pFVar1;
  Fl_Widget::callback((Fl_Widget *)this->window,cb_window,this);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,10,0x1d6,0x19,(char *)0x0);
  o_1 = (Fl_Button *)pFVar2;
  this_01 = (Fl_Choice *)operator_new(0x98);
  Fl_Choice::Fl_Choice(this_01,0x41,10,0xd7,0x19,"Show:");
  this->showChoice = this_01;
  Fl_Menu_::down_box(&this->showChoice->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::labelfont((Fl_Widget *)this->showChoice,1);
  Fl_Widget::callback((Fl_Widget *)this->showChoice,cb_showChoice);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)this->showChoice);
  Fl_Widget::label((Fl_Widget *)this->showChoice,show_label);
  this_02 = (Fl_Menu_Button *)operator_new(0x98);
  Fl_Menu_Button::Fl_Menu_Button(this_02,0x122,10,0x9b,0x19,"Favorites");
  this->favoritesButton = this_02;
  Fl_Menu_::down_box(&this->favoritesButton->super_Fl_Menu_,FL_BORDER_BOX);
  Fl_Widget::callback((Fl_Widget *)this->favoritesButton,cb_favoritesButton);
  Fl_Widget::align((Fl_Widget *)this->favoritesButton,0x14);
  Fl_Widget::label((Fl_Widget *)this->favoritesButton,favorites_label);
  this_03 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_03,0x1c7,10,0x19,0x19,(char *)0x0);
  this->newButton = this_03;
  pFVar8 = this->newButton;
  o_2 = (Fl_Tile *)this_03;
  img = image_new();
  Fl_Widget::image(&pFVar8->super_Fl_Widget,img);
  Fl_Widget::labelsize(&this->newButton->super_Fl_Widget,8);
  Fl_Widget::callback(&this->newButton->super_Fl_Widget,cb_newButton);
  Fl_Widget::tooltip((Fl_Widget *)o_2,new_directory_tooltip);
  Fl_Group::end((Fl_Group *)o_1);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Tile::Fl_Tile((Fl_Tile *)pFVar2,10,0x2d,0x1d6,0xe1,(char *)0x0);
  o_3 = pFVar2;
  Fl_Widget::callback((Fl_Widget *)pFVar2,cb_);
  pFVar3 = (Fl_File_Browser *)operator_new(0x2b8);
  Fl_File_Browser::Fl_File_Browser(pFVar3,10,0x2d,0x127,0xe1,(char *)0x0);
  this->fileList = pFVar3;
  Fl_Widget::type((Fl_Widget *)this->fileList,'\x02');
  Fl_Widget::callback((Fl_Widget *)this->fileList,cb_fileList);
  pFVar4 = Fl_Widget::window((Fl_Widget *)this->fileList);
  Fl_Window::hotspot(pFVar4,(Fl_Widget *)this->fileList,0);
  pFVar5 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar5,0x131,0x2d,0xaf,0xe1,"?");
  this->previewBox = pFVar5;
  Fl_Widget::box(&this->previewBox->super_Fl_Widget,FL_DOWN_BOX);
  Fl_Widget::labelsize(&this->previewBox->super_Fl_Widget,100);
  Fl_Widget::align(&this->previewBox->super_Fl_Widget,0x50);
  Fl_Group::end(o_3);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,&o_3->super_Fl_Widget);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x113,0x1d6,0x5f,(char *)0x0);
  o_4 = pFVar2;
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x113,0x1d6,0x14,(char *)0x0);
  o_5 = (Fl_Box *)pFVar2;
  pFVar6 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar6,10,0x113,0x49,0x14,"Preview");
  this->previewButton = pFVar6;
  Fl_Button::shortcut((Fl_Button *)this->previewButton,0x80070);
  Fl_Button::down_box((Fl_Button *)this->previewButton,FL_DOWN_BOX);
  Fl_Button::value((Fl_Button *)this->previewButton,1);
  Fl_Widget::callback((Fl_Widget *)this->previewButton,cb_previewButton);
  Fl_Widget::label((Fl_Widget *)this->previewButton,preview_label);
  pFVar6 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar6,0x73,0x113,0xa5,0x14,"Show hidden files");
  this->showHiddenButton = pFVar6;
  Fl_Button::down_box((Fl_Button *)this->showHiddenButton,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)this->showHiddenButton,cb_showHiddenButton);
  Fl_Widget::label((Fl_Widget *)this->showHiddenButton,hidden_label);
  pFVar5 = (Fl_Box *)operator_new(0x78);
  Fl_Box::Fl_Box(pFVar5,0x73,0x113,0x16d,0x14,(char *)0x0);
  o_6 = pFVar5;
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,&o_6->super_Fl_Widget);
  Fl_Group::end((Fl_Group *)o_5);
  this_04 = (Fl_File_Input *)operator_new(0x260);
  Fl_File_Input::Fl_File_Input(this_04,0x73,300,0x16d,0x23,(char *)0x0);
  this->fileName = this_04;
  Fl_Widget::labelfont((Fl_Widget *)this->fileName,1);
  Fl_Widget::callback((Fl_Widget *)this->fileName,cb_fileName);
  Fl_Widget::when((Fl_Widget *)this->fileName,'\b');
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)this->fileName);
  Fl_Widget::when((Fl_Widget *)this->fileName,'\v');
  pFVar2 = (Fl_Group *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,10,0x136,0x69,0x19,"Filename:");
  o_7 = pFVar2;
  Fl_Widget::labelfont((Fl_Widget *)pFVar2,1);
  Fl_Widget::align(&o_7->super_Fl_Widget,0x18);
  Fl_Widget::label(&o_7->super_Fl_Widget,filename_label);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x159,0x1d6,0x19,(char *)0x0);
  o_8 = (Fl_Button *)pFVar2;
  pFVar7 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(pFVar7,0x139,0x159,0x55,0x19,"OK");
  this->okButton = pFVar7;
  Fl_Widget::callback((Fl_Widget *)this->okButton,cb_okButton);
  Fl_Widget::label((Fl_Widget *)this->okButton,fl_ok);
  pFVar8 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar8,0x198,0x159,0x48,0x19,"Cancel");
  this->cancelButton = pFVar8;
  o_9 = (Fl_Box *)pFVar8;
  Fl_Widget::callback(&this->cancelButton->super_Fl_Widget,cb_cancelButton);
  Fl_Widget::label(&o_9->super_Fl_Widget,fl_cancel);
  pFVar2 = (Fl_Group *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar2,10,0x159,0x1e,0x19,(char *)0x0);
  o_10 = pFVar2;
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,&o_10->super_Fl_Widget);
  Fl_Group::end((Fl_Group *)o_8);
  Fl_Group::end(o_4);
  if (local_30 != (char *)0x0) {
    Fl_Window::label(&this->window->super_Fl_Window,local_30);
  }
  Fl_Window::set_modal(&this->window->super_Fl_Window);
  Fl_Group::end((Fl_Group *)this->window);
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x163,0x96,"Manage Favorites");
  this->favWindow = pFVar1;
  Fl_Widget::user_data((Fl_Widget *)this->favWindow,this);
  pFVar3 = (Fl_File_Browser *)operator_new(0x2b8);
  Fl_File_Browser::Fl_File_Browser(pFVar3,10,10,300,0x5f,(char *)0x0);
  this->favList = pFVar3;
  Fl_Widget::type((Fl_Widget *)this->favList,'\x02');
  Fl_Widget::callback((Fl_Widget *)this->favList,cb_favList);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,(Fl_Widget *)this->favList);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,0x140,10,0x19,0x5f,(char *)0x0);
  o_11 = pFVar2;
  pFVar8 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar8,0x140,10,0x19,0x19,"@8>");
  this->favUpButton = pFVar8;
  Fl_Widget::callback(&this->favUpButton->super_Fl_Widget,cb_favUpButton);
  pFVar8 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar8,0x140,0x2d,0x19,0x19,"X");
  this->favDeleteButton = pFVar8;
  Fl_Widget::labelfont(&this->favDeleteButton->super_Fl_Widget,1);
  Fl_Widget::callback(&this->favDeleteButton->super_Fl_Widget,cb_favDeleteButton);
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,&this->favDeleteButton->super_Fl_Widget);
  pFVar8 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar8,0x140,0x50,0x19,0x19,"@2>");
  this->favDownButton = pFVar8;
  Fl_Widget::callback(&this->favDownButton->super_Fl_Widget,cb_favDownButton);
  Fl_Group::end(o_11);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0x71,0x14f,0x1d,(char *)0x0);
  o_12 = (Fl_Box *)pFVar2;
  pFVar8 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar8,0x111,0x73,0x48,0x19,"Cancel");
  this->favCancelButton = pFVar8;
  Fl_Widget::callback(&this->favCancelButton->super_Fl_Widget,cb_favCancelButton);
  Fl_Widget::label(&this->favCancelButton->super_Fl_Widget,fl_cancel);
  pFVar7 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(pFVar7,0xb5,0x73,0x4f,0x19,"Save");
  this->favOkButton = pFVar7;
  Fl_Widget::callback((Fl_Widget *)this->favOkButton,cb_favOkButton);
  Fl_Widget::label((Fl_Widget *)this->favOkButton,save_label);
  this_05 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)this_05,10,0x73,0xa1,0x19,(char *)0x0);
  pFStack_b0 = this_05;
  pFVar2 = Fl_Group::current();
  Fl_Group::resizable(pFVar2,pFStack_b0);
  Fl_Group::end((Fl_Group *)o_12);
  Fl_Window::label(&this->favWindow->super_Fl_Window,manage_favorites_label);
  Fl_Window::set_modal(&this->favWindow->super_Fl_Window);
  Fl_Window::size_range(&this->favWindow->super_Fl_Window,0xb5,0x96,0,0,0,0,0);
  Fl_Group::end((Fl_Group *)this->favWindow);
  this->callback_ = (_func_void_Fl_File_Chooser_ptr_void_ptr *)0x0;
  this->data_ = (void *)0x0;
  this->directory_[0] = '\0';
  pFVar4 = &this->window->super_Fl_Window;
  minw = Fl_Widget::w((Fl_Widget *)this->window);
  minh = Fl_Widget::h((Fl_Widget *)this->window);
  maxw = Fl::w();
  maxh = Fl::h();
  Fl_Window::size_range(pFVar4,minw,minh,maxw,maxh,0,0,0);
  type(this,title_local._4_4_);
  filter(this,pcStack_20);
  update_favorites(this);
  value(this,p_local);
  type(this,title_local._4_4_);
  Fl_Preferences::get(prefs_,"preview",&local_b4,1);
  preview(this,local_b4);
  Fl_Group::current(o);
  this->ext_group = (Fl_Widget *)0x0;
  return;
}

Assistant:

Fl_File_Chooser::Fl_File_Chooser(const char *d, const char *p, int t, const char *title) {
  if (!prefs_) {
    prefs_ = new Fl_Preferences(Fl_Preferences::USER, "fltk.org", "filechooser");
  }
  Fl_Group *prev_current = Fl_Group::current();
  { window = new Fl_Double_Window(490, 380, "Choose File");
    window->callback((Fl_Callback*)cb_window, (void*)(this));
    { Fl_Group* o = new Fl_Group(10, 10, 470, 25);
      { showChoice = new Fl_Choice(65, 10, 215, 25, "Show:");
        showChoice->down_box(FL_BORDER_BOX);
        showChoice->labelfont(1);
        showChoice->callback((Fl_Callback*)cb_showChoice);
        Fl_Group::current()->resizable(showChoice);
        showChoice->label(show_label);
      } // Fl_Choice* showChoice
      { favoritesButton = new Fl_Menu_Button(290, 10, 155, 25, "Favorites");
        favoritesButton->down_box(FL_BORDER_BOX);
        favoritesButton->callback((Fl_Callback*)cb_favoritesButton);
        favoritesButton->align(Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_INSIDE));
        favoritesButton->label(favorites_label);
      } // Fl_Menu_Button* favoritesButton
      { Fl_Button* o = newButton = new Fl_Button(455, 10, 25, 25);
        newButton->image( image_new() );
        newButton->labelsize(8);
        newButton->callback((Fl_Callback*)cb_newButton);
        o->tooltip(new_directory_tooltip);
      } // Fl_Button* newButton
      o->end();
    } // Fl_Group* o
    { Fl_Tile* o = new Fl_Tile(10, 45, 470, 225);
      o->callback((Fl_Callback*)cb_);
      { fileList = new Fl_File_Browser(10, 45, 295, 225);
        fileList->type(2);
        fileList->callback((Fl_Callback*)cb_fileList);
        fileList->window()->hotspot(fileList);
      } // Fl_File_Browser* fileList
      { previewBox = new Fl_Box(305, 45, 175, 225, "?");
        previewBox->box(FL_DOWN_BOX);
        previewBox->labelsize(100);
        previewBox->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
      } // Fl_Box* previewBox
      o->end();
      Fl_Group::current()->resizable(o);
    } // Fl_Tile* o
    { Fl_Group* o = new Fl_Group(10, 275, 470, 95);
      { Fl_Group* o = new Fl_Group(10, 275, 470, 20);
        { previewButton = new Fl_Check_Button(10, 275, 73, 20, "Preview");
          previewButton->shortcut(0x80070);
          previewButton->down_box(FL_DOWN_BOX);
          previewButton->value(1);
          previewButton->callback((Fl_Callback*)cb_previewButton);
          previewButton->label(preview_label);
        } // Fl_Check_Button* previewButton
        { showHiddenButton = new Fl_Check_Button(115, 275, 165, 20, "Show hidden files");
          showHiddenButton->down_box(FL_DOWN_BOX);
          showHiddenButton->callback((Fl_Callback*)cb_showHiddenButton);
          showHiddenButton->label(hidden_label);
        } // Fl_Check_Button* showHiddenButton
        { Fl_Box* o = new Fl_Box(115, 275, 365, 20);
          Fl_Group::current()->resizable(o);
        } // Fl_Box* o
        o->end();
      } // Fl_Group* o
      { fileName = new Fl_File_Input(115, 300, 365, 35);
        fileName->labelfont(1);
        fileName->callback((Fl_Callback*)cb_fileName);
        fileName->when(FL_WHEN_ENTER_KEY);
        Fl_Group::current()->resizable(fileName);
        fileName->when(FL_WHEN_CHANGED | FL_WHEN_ENTER_KEY_ALWAYS);
      } // Fl_File_Input* fileName
      { Fl_Box* o = new Fl_Box(10, 310, 105, 25, "Filename:");
        o->labelfont(1);
        o->align(Fl_Align(FL_ALIGN_RIGHT|FL_ALIGN_INSIDE));
        o->label(filename_label);
      } // Fl_Box* o
      { Fl_Group* o = new Fl_Group(10, 345, 470, 25);
        { okButton = new Fl_Return_Button(313, 345, 85, 25, "OK");
          okButton->callback((Fl_Callback*)cb_okButton);
          okButton->label(fl_ok);
        } // Fl_Return_Button* okButton
        { Fl_Button* o = cancelButton = new Fl_Button(408, 345, 72, 25, "Cancel");
          cancelButton->callback((Fl_Callback*)cb_cancelButton);
          o->label(fl_cancel);
        } // Fl_Button* cancelButton
        { Fl_Box* o = new Fl_Box(10, 345, 30, 25);
          Fl_Group::current()->resizable(o);
        } // Fl_Box* o
        o->end();
      } // Fl_Group* o
      o->end();
    } // Fl_Group* o
    if (title) window->label(title);
    window->set_modal();
    window->end();
  } // Fl_Double_Window* window
  { favWindow = new Fl_Double_Window(355, 150, "Manage Favorites");
    favWindow->user_data((void*)(this));
    { favList = new Fl_File_Browser(10, 10, 300, 95);
      favList->type(2);
      favList->callback((Fl_Callback*)cb_favList);
      Fl_Group::current()->resizable(favList);
    } // Fl_File_Browser* favList
    { Fl_Group* o = new Fl_Group(320, 10, 25, 95);
      { favUpButton = new Fl_Button(320, 10, 25, 25, "@8>");
        favUpButton->callback((Fl_Callback*)cb_favUpButton);
      } // Fl_Button* favUpButton
      { favDeleteButton = new Fl_Button(320, 45, 25, 25, "X");
        favDeleteButton->labelfont(1);
        favDeleteButton->callback((Fl_Callback*)cb_favDeleteButton);
        Fl_Group::current()->resizable(favDeleteButton);
      } // Fl_Button* favDeleteButton
      { favDownButton = new Fl_Button(320, 80, 25, 25, "@2>");
        favDownButton->callback((Fl_Callback*)cb_favDownButton);
      } // Fl_Button* favDownButton
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 113, 335, 29);
      { favCancelButton = new Fl_Button(273, 115, 72, 25, "Cancel");
        favCancelButton->callback((Fl_Callback*)cb_favCancelButton);
        favCancelButton->label(fl_cancel);
      } // Fl_Button* favCancelButton
      { favOkButton = new Fl_Return_Button(181, 115, 79, 25, "Save");
        favOkButton->callback((Fl_Callback*)cb_favOkButton);
        favOkButton->label(save_label);
      } // Fl_Return_Button* favOkButton
      { Fl_Box* o = new Fl_Box(10, 115, 161, 25);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    favWindow->label(manage_favorites_label);
    favWindow->set_modal();
    favWindow->size_range(181, 150);
    favWindow->end();
  } // Fl_Double_Window* favWindow
  callback_ = 0;
  data_ = 0;
  directory_[0] = 0;
  window->size_range(window->w(), window->h(), Fl::w(), Fl::h());
  type(t);
  filter(p);
  update_favorites();
  value(d);
  type(t);
  int e;
  prefs_->get("preview", e, 1);
  preview(e);
  Fl_Group::current(prev_current);
  ext_group=(Fl_Widget*)0;
}